

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fire_PDU.cpp
# Opt level: O0

KString * __thiscall
KDIS::PDU::Fire_PDU::GetAsString_abi_cxx11_(KString *__return_storage_ptr__,Fire_PDU *this)

{
  ostream *poVar1;
  Descriptor *pDVar2;
  KString local_250;
  string local_230 [32];
  KString local_210;
  KString local_1f0;
  KString local_1c0;
  stringstream local_1a0 [8];
  KStringStream ss;
  ostream local_190 [376];
  Fire_PDU *local_18;
  Fire_PDU *this_local;
  
  local_18 = this;
  this_local = (Fire_PDU *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  Header7::GetAsString_abi_cxx11_(&local_1c0,(Header7 *)this);
  poVar1 = std::operator<<(local_190,(string *)&local_1c0);
  poVar1 = std::operator<<(poVar1,"-Fire PDU-\n");
  Warfare_Header::GetAsString_abi_cxx11_(&local_1f0,&this->super_Warfare_Header);
  poVar1 = std::operator<<(poVar1,(string *)&local_1f0);
  poVar1 = std::operator<<(poVar1,"Fire Mission Index:  ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->m_ui32FireMissionIndex);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"World Location:      ");
  DATA_TYPE::WorldCoordinates::GetAsString_abi_cxx11_(&local_210,&this->m_Location);
  poVar1 = std::operator<<(poVar1,(string *)&local_210);
  pDVar2 = UTILS::KRef_Ptr<KDIS::DATA_TYPE::Descriptor>::operator->(&this->m_pDescriptor);
  (*(pDVar2->super_DataTypeBase)._vptr_DataTypeBase[2])(local_230);
  poVar1 = std::operator<<(poVar1,local_230);
  poVar1 = std::operator<<(poVar1,"Velocity:            ");
  DATA_TYPE::Vector::GetAsString_abi_cxx11_(&local_250,&this->m_Velocity);
  poVar1 = std::operator<<(poVar1,(string *)&local_250);
  poVar1 = std::operator<<(poVar1,"Range:               ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(float)this->m_f32Range);
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string((string *)&local_250);
  std::__cxx11::string::~string(local_230);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString Fire_PDU::GetAsString() const
{
    KStringStream ss;

    ss << Header::GetAsString()
       << "-Fire PDU-\n"
       << Warfare_Header::GetAsString()
       << "Fire Mission Index:  " << m_ui32FireMissionIndex  << "\n"
       << "World Location:      " << m_Location.GetAsString()
       << m_pDescriptor->GetAsString()
       << "Velocity:            " << m_Velocity.GetAsString()
       << "Range:               " << m_f32Range             << "\n";

    return ss.str();
}